

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::ColorTooltip(char *text,float *col,ImGuiColorEditFlags flags)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint in_EDX;
  float *in_RSI;
  char *in_RDI;
  float fVar4;
  int ca;
  int cb;
  int cg;
  int cr;
  ImVec4 cf;
  ImVec2 sz;
  char *text_end;
  ImGuiContext *g;
  char *in_stack_00000098;
  char *in_stack_000000a0;
  ImGuiColorEditFlags in_stack_000000d4;
  ImVec4 *in_stack_000000d8;
  char *in_stack_000000e0;
  ImVec2 in_stack_000000ec;
  float in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff74;
  uint local_74;
  float local_70;
  char *local_60;
  ImGuiWindowFlags in_stack_ffffffffffffffb0;
  ImGuiTooltipFlags in_stack_ffffffffffffffb4;
  ImVec4 local_40;
  ImVec2 local_30;
  char *local_28;
  ImGuiContext *local_20;
  uint local_14;
  float *local_10;
  char *local_8;
  
  local_20 = GImGui;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  BeginTooltipEx(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0);
  if (local_8 == (char *)0x0) {
    local_60 = local_8;
  }
  else {
    local_60 = FindRenderedTextEnd(local_8,(char *)0x0);
  }
  local_28 = local_60;
  if (local_8 < local_60) {
    TextEx(in_stack_000000a0,in_stack_00000098,text._4_4_);
    Separator();
  }
  ImVec2::ImVec2(&local_30,local_20->FontSize * 3.0 + (local_20->Style).FramePadding.y * 2.0,
                 local_20->FontSize * 3.0 + (local_20->Style).FramePadding.y * 2.0);
  if ((local_14 & 2) == 0) {
    local_70 = local_10[3];
  }
  else {
    local_70 = 1.0;
  }
  ImVec4::ImVec4(&local_40,*local_10,local_10[1],local_10[2],local_70);
  fVar4 = ImSaturate(*local_10);
  uVar1 = (uint)(fVar4 * 255.0 + 0.5);
  fVar4 = ImSaturate(local_10[1]);
  uVar2 = (uint)(fVar4 * 255.0 + 0.5);
  fVar4 = ImSaturate(local_10[2]);
  uVar3 = (uint)(fVar4 * 255.0 + 0.5);
  if ((local_14 & 2) == 0) {
    fVar4 = ImSaturate(local_10[3]);
    local_74 = (uint)(fVar4 * 255.0 + 0.5);
  }
  else {
    local_74 = 0xff;
  }
  ColorButton(in_stack_000000e0,in_stack_000000d8,in_stack_000000d4,in_stack_000000ec);
  SameLine(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70);
  if (((local_14 & 0x8000000) == 0) && ((local_14 & 0x18000000) != 0)) {
    if ((local_14 & 0x10000000) != 0) {
      if ((local_14 & 2) == 0) {
        Text((char *)(double)*local_10,(double)local_10[1],(double)local_10[2],(double)local_10[3],
             "H: %.3f, S: %.3f, V: %.3f, A: %.3f");
      }
      else {
        Text((char *)(double)*local_10,(double)local_10[1],(double)local_10[2],
             "H: %.3f, S: %.3f, V: %.3f");
      }
    }
  }
  else if ((local_14 & 2) == 0) {
    Text((char *)(double)*local_10,(double)local_10[1],(double)local_10[2],(double)local_10[3],
         "#%02X%02X%02X%02X\nR:%d, G:%d, B:%d, A:%d\n(%.3f, %.3f, %.3f, %.3f)",(ulong)uVar1,
         (ulong)uVar2,(ulong)uVar3,(ulong)local_74,(ulong)uVar1,uVar2,uVar3,local_74);
  }
  else {
    Text((char *)(double)*local_10,(double)local_10[1],(double)local_10[2],
         "#%02X%02X%02X\nR: %d, G: %d, B: %d\n(%.3f, %.3f, %.3f)",(ulong)uVar1,(ulong)uVar2,
         (ulong)uVar3,(ulong)uVar1,(ulong)uVar2,uVar3);
  }
  EndTooltip();
  return;
}

Assistant:

void ImGui::ColorTooltip(const char* text, const float* col, ImGuiColorEditFlags flags)
{
    ImGuiContext& g = *GImGui;

    BeginTooltipEx(ImGuiTooltipFlags_OverridePreviousTooltip, ImGuiWindowFlags_None);
    const char* text_end = text ? FindRenderedTextEnd(text, NULL) : text;
    if (text_end > text)
    {
        TextEx(text, text_end);
        Separator();
    }

    ImVec2 sz(g.FontSize * 3 + g.Style.FramePadding.y * 2, g.FontSize * 3 + g.Style.FramePadding.y * 2);
    ImVec4 cf(col[0], col[1], col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : col[3]);
    int cr = IM_F32_TO_INT8_SAT(col[0]), cg = IM_F32_TO_INT8_SAT(col[1]), cb = IM_F32_TO_INT8_SAT(col[2]), ca = (flags & ImGuiColorEditFlags_NoAlpha) ? 255 : IM_F32_TO_INT8_SAT(col[3]);
    ColorButton("##preview", cf, (flags & (ImGuiColorEditFlags_InputMask_ | ImGuiColorEditFlags_NoAlpha | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf)) | ImGuiColorEditFlags_NoTooltip, sz);
    SameLine();
    if ((flags & ImGuiColorEditFlags_InputRGB) || !(flags & ImGuiColorEditFlags_InputMask_))
    {
        if (flags & ImGuiColorEditFlags_NoAlpha)
            Text("#%02X%02X%02X\nR: %d, G: %d, B: %d\n(%.3f, %.3f, %.3f)", cr, cg, cb, cr, cg, cb, col[0], col[1], col[2]);
        else
            Text("#%02X%02X%02X%02X\nR:%d, G:%d, B:%d, A:%d\n(%.3f, %.3f, %.3f, %.3f)", cr, cg, cb, ca, cr, cg, cb, ca, col[0], col[1], col[2], col[3]);
    }
    else if (flags & ImGuiColorEditFlags_InputHSV)
    {
        if (flags & ImGuiColorEditFlags_NoAlpha)
            Text("H: %.3f, S: %.3f, V: %.3f", col[0], col[1], col[2]);
        else
            Text("H: %.3f, S: %.3f, V: %.3f, A: %.3f", col[0], col[1], col[2], col[3]);
    }
    EndTooltip();
}